

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

int __thiscall ot::commissioner::MockSocket::Send(MockSocket *this,ByteArray *aBuf)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  
  puVar1 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    iVar3 = (*(this->super_Socket)._vptr_Socket[6])(this,puVar1,(long)puVar2 - (long)puVar1);
    return iVar3;
  }
  abort();
}

Assistant:

int MockSocket::Send(const ByteArray &aBuf)
{
    VerifyOrDie(!aBuf.empty());
    return Send(aBuf.data(), aBuf.size());
}